

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_GetEndpoints
               (UA_Server *server,UA_Session *session,UA_GetEndpointsRequest *request,
               UA_GetEndpointsResponse *response)

{
  UA_Byte *pUVar1;
  size_t sVar2;
  long lVar3;
  UA_Boolean *src;
  UA_Boolean UVar4;
  UA_StatusCode UVar5;
  long lVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  undefined8 in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffee8;
  UA_Byte *local_110;
  undefined1 auStack_108 [8];
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  UA_Logger local_e8;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  UA_Byte *local_d0;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  UA_Logger local_b8;
  UA_Byte *local_b0;
  size_t j_2;
  size_t i_1;
  long lStack_98;
  UA_StatusCode retval;
  size_t k;
  ulong uStack_88;
  UA_Boolean nl_endpointurl;
  size_t clone_times;
  size_t i;
  size_t j_1;
  size_t j;
  size_t relevant_count;
  UA_Boolean *relevant_endpoints;
  UA_String *endpointUrl;
  UA_GetEndpointsResponse *response_local;
  UA_GetEndpointsRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  relevant_endpoints = (UA_Boolean *)&request->endpointUrl;
  endpointUrl = (UA_String *)response;
  response_local = (UA_GetEndpointsResponse *)request;
  request_local = (UA_GetEndpointsRequest *)session;
  session_local = (UA_Session *)server;
  if (((UA_String *)relevant_endpoints)->length == 0) {
    local_e8 = (server->config).logger;
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_f0 = 0;
    }
    else {
      if (session->channel->connection == (UA_Connection *)0x0) {
        local_ec = 0;
      }
      else {
        local_ec = session->channel->connection->sockfd;
      }
      local_f0 = local_ec;
    }
    local_f4 = local_f0;
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_f8 = 0;
    }
    else {
      local_f8 = (session->channel->securityToken).channelId;
    }
    local_100 = (uint)(session->sessionId).identifier.guid.data3;
    local_fc = (uint)(session->sessionId).identifier.guid.data4[7];
    local_110 = (UA_Byte *)CONCAT44(local_110._4_4_,local_fc);
    UA_LOG_DEBUG(local_e8,UA_LOGCATEGORY_SESSION,
                 "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing GetEndpointsRequest with an empty endpointUrl"
                 ,(ulong)local_f0,(ulong)local_f8,(ulong)(session->sessionId).identifier.numeric,
                 (uint)(session->sessionId).identifier.guid.data2,local_100,
                 (uint)(session->sessionId).identifier.guid.data4[0],
                 (uint)(session->sessionId).identifier.guid.data4[1],
                 (uint)(session->sessionId).identifier.guid.data4[2],
                 (uint)(session->sessionId).identifier.guid.data4[3],
                 (uint)(session->sessionId).identifier.guid.data4[4],
                 (uint)(session->sessionId).identifier.guid.data4[5],
                 CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                          (uint)(session->sessionId).identifier.guid.data4[6]));
  }
  else {
    local_b8 = (server->config).logger;
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_c0 = 0;
    }
    else {
      if (session->channel->connection == (UA_Connection *)0x0) {
        local_bc = 0;
      }
      else {
        local_bc = session->channel->connection->sockfd;
      }
      local_c0 = local_bc;
    }
    local_c4 = local_c0;
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_c8 = 0;
    }
    else {
      local_c8 = (session->channel->securityToken).channelId;
    }
    local_dc = (uint)(session->sessionId).identifier.guid.data3;
    local_d8 = (uint)(session->sessionId).identifier.guid.data4[0];
    local_d4 = (uint)(session->sessionId).identifier.guid.data4[1];
    local_110 = (request->endpointUrl).data;
    local_d0 = local_110;
    UA_LOG_DEBUG(local_b8,UA_LOGCATEGORY_SESSION,
                 "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing GetEndpointsRequest with endpointUrl \"%.*s\""
                 ,(ulong)local_c0,(ulong)local_c8,(ulong)(session->sessionId).identifier.numeric,
                 (uint)(session->sessionId).identifier.guid.data2,
                 CONCAT44((int)((ulong)in_stack_fffffffffffffea0 >> 0x20),local_dc),local_d8,
                 local_d4,(uint)(session->sessionId).identifier.guid.data4[2],
                 (uint)(session->sessionId).identifier.guid.data4[3],
                 (uint)(session->sessionId).identifier.guid.data4[4],
                 (uint)(session->sessionId).identifier.guid.data4[5],
                 (uint)(session->sessionId).identifier.guid.data4[6],
                 (uint)(session->sessionId).identifier.guid.data4[7],
                 ((UA_String *)relevant_endpoints)->length);
  }
  lVar3 = -((ulong)((session_local->clientDescription).applicationUri.data + 0xf) &
           0xfffffffffffffff0);
  pUVar1 = (session_local->clientDescription).applicationUri.data;
  relevant_count = (size_t)(auStack_108 + lVar3);
  *(undefined8 *)(auStack_108 + lVar3 + -8) = 0x1297aa;
  memset(auStack_108 + lVar3,0,(size_t)pUVar1);
  j = 0;
  if (response_local->endpoints == (UA_EndpointDescription *)0x0) {
    for (j_1 = 0; j_1 < (session_local->clientDescription).applicationUri.data; j_1 = j_1 + 1) {
      *(undefined1 *)(relevant_count + j_1) = 1;
    }
    j = (size_t)(session_local->clientDescription).applicationUri.data;
  }
  else {
    for (i = 0; i < (session_local->clientDescription).applicationUri.data; i = i + 1) {
      for (clone_times = 0; clone_times < response_local->endpoints; clone_times = clone_times + 1)
      {
        lVar8 = response_local[1].responseHeader.timestamp;
        lVar9 = clone_times * 0x10;
        sVar10 = (session_local->clientDescription).productUri.length;
        lVar6 = i * 0xd8;
        *(undefined8 *)(auStack_108 + lVar3 + -8) = 0x129869;
        UVar4 = UA_String_equal((UA_String *)(lVar8 + lVar9),(UA_String *)(sVar10 + lVar6 + 0xc0));
        if (UVar4) {
          *(undefined1 *)(relevant_count + i) = 1;
          j = j + 1;
          break;
        }
      }
    }
  }
  if (j == 0) {
    endpointUrl[8].data = (UA_Byte *)0x0;
  }
  else {
    uStack_88 = 1;
    k._7_1_ = *(long *)relevant_endpoints == 0;
    if ((bool)k._7_1_) {
      uStack_88 = session_local[1].clientDescription.discoveryProfileUri.length;
    }
    sVar10 = j * uStack_88;
    *(undefined8 *)(auStack_108 + lVar3 + -8) = 0x129912;
    pvVar7 = UA_Array_new(sVar10,UA_TYPES + 0x9b);
    endpointUrl[9].length = (size_t)pvVar7;
    if (endpointUrl[9].length == 0) {
      *(undefined4 *)((long)&endpointUrl->data + 4) = 0x80030000;
    }
    else {
      endpointUrl[8].data = (UA_Byte *)(j * uStack_88);
      lStack_98 = 0;
      i_1._4_4_ = 0;
      for (j_2 = 0; j_2 < uStack_88; j_2 = j_2 + 1) {
        if ((k._7_1_ & 1) != 0) {
          relevant_endpoints =
               (UA_Boolean *)
               (session_local[1].clientDescription.discoveryProfileUri.data + j_2 * 0x38 + 8);
        }
        for (local_b0 = (UA_Byte *)0x0;
            local_b0 < (session_local->clientDescription).applicationUri.data;
            local_b0 = local_b0 + 1) {
          if ((local_b0[relevant_count] & 1) != 0) {
            sVar10 = (session_local->clientDescription).productUri.length;
            lVar8 = (long)local_b0 * 0xd8;
            sVar2 = endpointUrl[9].length;
            lVar9 = lStack_98 * 0xd8;
            *(undefined8 *)(auStack_108 + lVar3 + -8) = 0x129a14;
            UVar5 = UA_EndpointDescription_copy
                              ((UA_EndpointDescription *)(sVar10 + lVar8),
                               (UA_EndpointDescription *)(sVar2 + lVar9));
            src = relevant_endpoints;
            i_1._4_4_ = UVar5 | i_1._4_4_;
            sVar10 = endpointUrl[9].length;
            lVar8 = lStack_98 * 0xd8;
            *(undefined8 *)(auStack_108 + lVar3 + -8) = 0x129a42;
            UVar5 = UA_String_copy((UA_String *)src,(UA_String *)(sVar10 + lVar8));
            i_1._4_4_ = UVar5 | i_1._4_4_;
            lStack_98 = lStack_98 + 1;
          }
        }
      }
      if (i_1._4_4_ != 0) {
        *(uint *)((long)&endpointUrl->data + 4) = i_1._4_4_;
        pvVar7 = (void *)endpointUrl[9].length;
        pUVar1 = endpointUrl[8].data;
        *(undefined8 *)(auStack_108 + lVar3 + -8) = 0x129acf;
        UA_Array_delete(pvVar7,(size_t)pUVar1,UA_TYPES + 0x9b);
        endpointUrl[9].length = 0;
        endpointUrl[8].data = (UA_Byte *)0x0;
      }
    }
  }
  return;
}

Assistant:

void Service_GetEndpoints(UA_Server *server, UA_Session *session, const UA_GetEndpointsRequest *request,
                          UA_GetEndpointsResponse *response) {
    /* If the client expects to see a specific endpointurl, mirror it back. If
       not, clone the endpoints with the discovery url of all networklayers. */
    const UA_String *endpointUrl = &request->endpointUrl;
    if(endpointUrl->length > 0) {
        UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing GetEndpointsRequest with endpointUrl " \
                             UA_PRINTF_STRING_FORMAT, UA_PRINTF_STRING_DATA(*endpointUrl));
    } else {
        UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing GetEndpointsRequest with an empty endpointUrl");
    }

    /* test if the supported binary profile shall be returned */
#ifdef NO_ALLOCA
    UA_Boolean relevant_endpoints[server->endpointDescriptionsSize];
#else
    UA_Boolean *relevant_endpoints = UA_alloca(sizeof(UA_Boolean) * server->endpointDescriptionsSize);
#endif
    memset(relevant_endpoints, 0, sizeof(UA_Boolean) * server->endpointDescriptionsSize);
    size_t relevant_count = 0;
    if(request->profileUrisSize == 0) {
        for(size_t j = 0; j < server->endpointDescriptionsSize; ++j)
            relevant_endpoints[j] = true;
        relevant_count = server->endpointDescriptionsSize;
    } else {
        for(size_t j = 0; j < server->endpointDescriptionsSize; ++j) {
            for(size_t i = 0; i < request->profileUrisSize; ++i) {
                if(!UA_String_equal(&request->profileUris[i], &server->endpointDescriptions[j].transportProfileUri))
                    continue;
                relevant_endpoints[j] = true;
                ++relevant_count;
                break;
            }
        }
    }

    if(relevant_count == 0) {
        response->endpointsSize = 0;
        return;
    }

    /* Clone the endpoint for each networklayer? */
    size_t clone_times = 1;
    UA_Boolean nl_endpointurl = false;
    if(endpointUrl->length == 0) {
        clone_times = server->config.networkLayersSize;
        nl_endpointurl = true;
    }

    response->endpoints = UA_Array_new(relevant_count * clone_times, &UA_TYPES[UA_TYPES_ENDPOINTDESCRIPTION]);
    if(!response->endpoints) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->endpointsSize = relevant_count * clone_times;

    size_t k = 0;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    for(size_t i = 0; i < clone_times; ++i) {
        if(nl_endpointurl)
            endpointUrl = &server->config.networkLayers[i].discoveryUrl;
        for(size_t j = 0; j < server->endpointDescriptionsSize; ++j) {
            if(!relevant_endpoints[j])
                continue;
            retval |= UA_EndpointDescription_copy(&server->endpointDescriptions[j], &response->endpoints[k]);
            retval |= UA_String_copy(endpointUrl, &response->endpoints[k].endpointUrl);
            ++k;
        }
    }

    if(retval != UA_STATUSCODE_GOOD) {
        response->responseHeader.serviceResult = retval;
        UA_Array_delete(response->endpoints, response->endpointsSize, &UA_TYPES[UA_TYPES_ENDPOINTDESCRIPTION]);
        response->endpoints = NULL;
        response->endpointsSize = 0;
        return;
    }
}